

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O0

bool __thiscall Clasp::ClaspFacade::SolveStrategy::Async::doWait(Async *this,double t)

{
  bool bVar1;
  uint uVar2;
  __sighandler_t p_Var3;
  __sighandler_t extraout_RDX;
  __sighandler_t extraout_RDX_00;
  __sighandler_t extraout_RDX_01;
  __sighandler_t extraout_RDX_02;
  ClaspFacade **ppCVar4;
  SolveStrategy *in_RDI;
  double in_XMM0_Qa;
  unique_lock<std::mutex> lock;
  uint in_stack_00000068;
  uint in_stack_0000006c;
  atomic<unsigned_int> *in_stack_00000070;
  undefined2 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffba;
  undefined1 in_stack_ffffffffffffffbb;
  undefined4 in_stack_ffffffffffffffbc;
  int local_38;
  double in_stack_ffffffffffffffd0;
  ClaspFacade *in_stack_ffffffffffffffd8;
  condition_variable *in_stack_ffffffffffffffe0;
  double local_18;
  byte local_1;
  
  ppCVar4 = &in_RDI[1].facade_;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)in_RDI,
             (mutex_type *)
             CONCAT44(in_stack_ffffffffffffffbc,
                      CONCAT13(in_stack_ffffffffffffffbb,
                               CONCAT12(in_stack_ffffffffffffffba,in_stack_ffffffffffffffb8))));
  p_Var3 = extraout_RDX;
  local_18 = in_XMM0_Qa;
  while( true ) {
    while ((p_Var3 = signal(in_RDI,(int)ppCVar4,p_Var3), (int)p_Var3 != 0 &&
           (bVar1 = running((SolveStrategy *)0x12ae8a), bVar1))) {
      std::condition_variable::notify_all();
      ppCVar4 = (ClaspFacade **)&stack0xffffffffffffffd8;
      std::condition_variable::wait((unique_lock *)(in_RDI[1].error_.field_2._M_local_buf + 8));
      p_Var3 = extraout_RDX_00;
    }
    bVar1 = ready((SolveStrategy *)0x12aeed);
    if (bVar1) break;
    if (0.0 <= local_18) {
      if (local_18 <= 0.0) {
        local_1 = 0;
        local_38 = 1;
LAB_0012af7c:
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_RDI);
        if (local_38 != 1) {
          uVar2 = compare_and_swap<unsigned_int>
                            (in_stack_00000070,in_stack_0000006c,in_stack_00000068);
          if ((uVar2 == 4) &&
             (uVar2 = compare_and_swap<unsigned_int>
                                (in_stack_00000070,in_stack_0000006c,in_stack_00000068), uVar2 == 4)
             ) {
            std::thread::join();
          }
          local_1 = 1;
        }
        return (bool)(local_1 & 1);
      }
      ppCVar4 = (ClaspFacade **)&stack0xffffffffffffffd8;
      mt::condition_variable::wait_for
                (in_stack_ffffffffffffffe0,(unique_lock<std::mutex> *)in_stack_ffffffffffffffd8,
                 in_stack_ffffffffffffffd0);
      local_18 = 0.0;
      p_Var3 = extraout_RDX_02;
    }
    else {
      ppCVar4 = (ClaspFacade **)&stack0xffffffffffffffd8;
      std::condition_variable::wait((unique_lock *)(in_RDI[1].error_.field_2._M_local_buf + 8));
      p_Var3 = extraout_RDX_01;
    }
  }
  local_38 = 2;
  goto LAB_0012af7c;
}

Assistant:

virtual bool doWait(double t) {
		for (mt::unique_lock<Clasp::mt::mutex> lock(mqMutex_);;) {
			if (signal() && running()) { // propagate signal to async thread and force wait
				mqCond_.notify_all();
				mqCond_.wait(lock);
			}
			else if (ready()) { break; }
			else if (t < 0.0) { mqCond_.wait(lock); }
			else if (t > 0.0) { mqCond_.wait_for(lock, t); t = 0.0; }
			else              { return false; }
		}
		assert(ready());
		// acknowledge current model or join if first to see done
		if (compare_and_swap(state_, uint32(state_next), uint32(state_model)) == state_done
			&& compare_and_swap(state_, uint32(state_done), uint32(state_join)) == state_done) {
			task_.join();
		}
		return true;
	}